

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall fs::Path::setExtension(Path *this,string *string)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  __rhs = &this->_extension;
  std::__cxx11::string::_M_assign((string *)__rhs);
  if (*(this->_extension)._M_dataplus._M_p != '.') {
    std::operator+(&bStack_38,'.',__rhs);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  updateFile(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setExtension(std::string const& string)
{
  _extension = string;
  if (_extension[0] != '.')
    _extension = '.' + _extension;
  updateFile();
  return *this;
}